

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O3

int __thiscall DetectorSS::loghash(DetectorSS *this,unsigned_long p)

{
  ulong uVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((p & 1) != 0) {
    iVar2 = 0;
    do {
      iVar2 = iVar2 + 1;
      uVar1 = p & 2;
      p = p >> 1;
    } while (uVar1 != 0);
  }
  return iVar2;
}

Assistant:

int DetectorSS::loghash(unsigned long p) {
	int ret = 0;
	while ((p & 0x00000001) == 1) {
		p >>= 1;
		ret++;
	}
	return ret;
}